

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackFrame.SystemV.cpp
# Opt level: O0

bool __thiscall
Js::Amd64StackFrame::InitializeByFrameId
          (Amd64StackFrame *this,void *frame,ScriptContext *scriptContext)

{
  bool bVar1;
  ThreadContext *pTVar2;
  size_t local_30;
  ScriptContext *scriptContext_local;
  void *frame_local;
  Amd64StackFrame *this_local;
  
  this->frame = (void **)frame;
  pTVar2 = ScriptContext::GetThreadContext(scriptContext);
  bVar1 = ThreadContext::DoInterruptProbe(pTVar2);
  if (bVar1) {
    local_30 = 0x44;
  }
  else {
    pTVar2 = ScriptContext::GetThreadContext(scriptContext);
    bVar1 = ThreadContext::IsThreadBound(pTVar2);
    local_30 = 0x3e;
    if (bVar1) {
      local_30 = 0x39;
    }
  }
  this->stackCheckCodeHeight = local_30;
  bVar1 = Next(this);
  return bVar1;
}

Assistant:

bool
Amd64StackFrame::InitializeByFrameId(void * frame, ScriptContext* scriptContext)
{
    this->frame = (void **)frame;

    this->stackCheckCodeHeight =
        scriptContext->GetThreadContext()->DoInterruptProbe() ? stackCheckCodeHeightWithInterruptProbe
        : scriptContext->GetThreadContext()->IsThreadBound() ? stackCheckCodeHeightThreadBound
        : stackCheckCodeHeightNotThreadBound;

    return Next();
}